

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O1

void __thiscall
QProcessEnvironmentPrivate::insert
          (QProcessEnvironmentPrivate *this,QProcessEnvironmentPrivate *other)

{
  QMapData<std::map<QByteArray,_QProcEnvValue,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QProcEnvValue>_>_>_>
  *pQVar1;
  Entry *pEVar2;
  _Base_ptr p_Var3;
  ulong uVar4;
  _Base_ptr p_Var5;
  Data *pDVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  QOrderedMutexLocker local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (other->vars).d.d.ptr;
  if (pQVar1 == (QMapData<std::map<QByteArray,_QProcEnvValue,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QProcEnvValue>_>_>_>
                 *)0x0) {
    p_Var3 = (_Base_ptr)0x0;
  }
  else {
    p_Var3 = *(_Base_ptr *)((long)&(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  }
  p_Var5 = &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (pQVar1 == (QMapData<std::map<QByteArray,_QProcEnvValue,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QProcEnvValue>_>_>_>
                 *)0x0) {
    p_Var5 = (_Base_ptr)0x0;
  }
  if (p_Var3 != p_Var5) {
    do {
      QMap<QByteArray,_QProcEnvValue>::insert
                (&this->vars,(QByteArray *)(p_Var3 + 1),(QProcEnvValue *)&p_Var3[1]._M_right);
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while (p_Var3 != p_Var5);
  }
  local_48.mtx1 = &(this->nameMapMutex).super_QBasicMutex;
  if (this == other) {
    local_48.mtx2 = &((QMutex *)0x0)->super_QBasicMutex;
  }
  else {
    local_48.mtx2 = &(other->nameMapMutex).super_QBasicMutex;
    if (other <= this) {
      local_48.mtx2 = local_48.mtx1;
      local_48.mtx1 = &(other->nameMapMutex).super_QBasicMutex;
    }
  }
  local_48.locked = false;
  local_48._17_7_ = 0xaaaaaaaaaaaaaa;
  QOrderedMutexLocker::relock(&local_48);
  pDVar6 = (other->nameMap).d;
  if (pDVar6 == (Data *)0x0) {
    pDVar6 = (Data *)0x0;
  }
  else if (pDVar6->spans->offsets[0] == 0xff) {
    uVar4 = 1;
    do {
      uVar7 = uVar4;
      if (pDVar6->numBuckets == uVar7) {
        pDVar6 = (Data *)0x0;
        uVar7 = 0;
        break;
      }
      uVar4 = uVar7 + 1;
    } while (pDVar6->spans[uVar7 >> 7].offsets[(uint)uVar7 & 0x7f] == 0xff);
    goto LAB_0042935b;
  }
  uVar7 = 0;
LAB_0042935b:
  if (pDVar6 != (Data *)0x0 || uVar7 != 0) {
    do {
      pEVar2 = pDVar6->spans[uVar7 >> 7].entries;
      uVar4 = (ulong)((uint)pDVar6->spans[uVar7 >> 7].offsets[(uint)uVar7 & 0x7f] * 0x30);
      QHash<QString,QByteArray>::emplace<QByteArray_const&>
                ((QHash<QString,QByteArray> *)&this->nameMap,
                 (QString *)((pEVar2->storage).data + uVar4),
                 (QByteArray *)((pEVar2->storage).data + uVar4 + 0x18));
      do {
        if (pDVar6->numBuckets - 1 == uVar7) {
          pDVar6 = (Data *)0x0;
          uVar7 = 0;
          break;
        }
        uVar7 = uVar7 + 1;
      } while (pDVar6->spans[uVar7 >> 7].offsets[(uint)uVar7 & 0x7f] == 0xff);
    } while ((pDVar6 != (Data *)0x0) || (uVar7 != 0));
  }
  QOrderedMutexLocker::unlock(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QProcessEnvironmentPrivate::insert(const QProcessEnvironmentPrivate &other)
{
    auto it = other.vars.constBegin();
    const auto end = other.vars.constEnd();
    for ( ; it != end; ++it)
        vars.insert(it.key(), it.value());

#ifdef Q_OS_UNIX
    const OrderedNameMapMutexLocker locker(this, &other);
    auto nit = other.nameMap.constBegin();
    const auto nend = other.nameMap.constEnd();
    for ( ; nit != nend; ++nit)
        nameMap.insert(nit.key(), nit.value());
#endif
}